

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timestamp_comparison.cpp
# Opt level: O3

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::TimeStampComparison::Apply
          (TimeStampComparison *this,LogicalOperator *op,
          vector<std::reference_wrapper<duckdb::Expression>,_true> *bindings,bool *changes_made,
          bool is_root)

{
  ClientContext *context;
  _Head_base<0UL,_duckdb::BoundConjunctionExpression_*,_false> _Var1;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var2;
  undefined8 uVar3;
  bool bVar4;
  date_t dVar5;
  reference pvVar6;
  type pEVar7;
  BoundConjunctionExpression *this_00;
  BoundConstantExpression *pBVar8;
  timestamp_t value;
  pointer pEVar9;
  pointer pBVar10;
  bool is_constant;
  date_t date_t_result;
  Value result;
  Value original_val_plus_on_date_ts;
  Value result_as_val;
  Value original_val_ts;
  bool local_1ba;
  ExpressionType local_1b9;
  _Head_base<0UL,_duckdb::BoundConjunctionExpression_*,_false> local_1b8;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_1b0;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_1a8;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> local_1a0;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_198;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_190;
  _Head_base<0UL,_duckdb::BoundConstantExpression_*,_false> local_188;
  _Head_base<0UL,_duckdb::BoundConstantExpression_*,_false> local_180;
  date_t local_174;
  Value local_170;
  LogicalType local_130;
  Value local_118;
  Value local_d8;
  Value local_98;
  Value local_58;
  
  pvVar6 = vector<std::reference_wrapper<duckdb::Expression>,_true>::operator[]
                     ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)changes_made,3);
  (*(pvVar6->_M_data->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_1a8);
  pvVar6 = vector<std::reference_wrapper<duckdb::Expression>,_true>::operator[]
                     ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)changes_made,2);
  (*(pvVar6->_M_data->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_1b0);
  local_1ba = true;
  pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)&local_1a8);
  ExpressionIsConstant(pEVar7,&local_1ba);
  if (local_1ba == false) {
    pvVar6 = vector<std::reference_wrapper<duckdb::Expression>,_true>::operator[]
                       ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)changes_made,4);
    (*(pvVar6->_M_data->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_170);
    uVar3 = local_170.type_._0_8_;
    _Var2._M_head_impl = local_1a8._M_head_impl;
    local_170.type_._0_8_ =
         (tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)0x0;
    local_1a8._M_head_impl = (Expression *)uVar3;
    if (_Var2._M_head_impl != (Expression *)0x0) {
      (*((_Var2._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      if ((_Head_base<0UL,_duckdb::Expression_*,_false>)local_170.type_._0_8_ !=
          (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0) {
        (*((BaseExpression *)local_170.type_._0_8_)->_vptr_BaseExpression[1])();
      }
    }
    pvVar6 = vector<std::reference_wrapper<duckdb::Expression>,_true>::operator[]
                       ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)changes_made,3);
    (*(pvVar6->_M_data->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_170);
    uVar3 = local_170.type_._0_8_;
    _Var2._M_head_impl = local_1b0._M_head_impl;
    local_170.type_._0_8_ =
         (tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)0x0;
    local_1b0._M_head_impl = (Expression *)uVar3;
    if (_Var2._M_head_impl != (Expression *)0x0) {
      (*((_Var2._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      if ((_Head_base<0UL,_duckdb::Expression_*,_false>)local_170.type_._0_8_ !=
          (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0) {
        (*((BaseExpression *)local_170.type_._0_8_)->_vptr_BaseExpression[1])();
      }
    }
  }
  this_00 = (BoundConjunctionExpression *)operator_new(0x70);
  BoundConjunctionExpression::BoundConjunctionExpression(this_00,CONJUNCTION_AND);
  local_1b8._M_head_impl = this_00;
  LogicalType::LogicalType(&local_130,SQLNULL);
  Value::Value(&local_118,&local_130);
  LogicalType::~LogicalType(&local_130);
  context = (ClientContext *)
            (op->children).
            super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)&local_1a8);
  bVar4 = ExpressionExecutor::TryEvaluateScalar(context,pEVar7,&local_118);
  if (bVar4) {
    dVar5 = Value::GetValue<duckdb::date_t>(&local_118);
    Value::TIMESTAMP(&local_58,dVar5,(dtime_t)0x0);
    pBVar8 = (BoundConstantExpression *)operator_new(0x98);
    Value::Value(&local_170,&local_58);
    BoundConstantExpression::BoundConstantExpression(pBVar8,&local_170);
    local_180._M_head_impl = pBVar8;
    Value::~Value(&local_170);
    dVar5 = Value::GetValue<duckdb::date_t>(&local_118);
    bVar4 = TryAddOperator::Operation<duckdb::date_t,int,duckdb::date_t>(dVar5,1,&local_174);
    if (bVar4) {
      Value::DATE(&local_98,local_174);
      value = Value::GetValue<duckdb::timestamp_t>(&local_98);
      Value::TIMESTAMP(&local_d8,value);
      pBVar8 = (BoundConstantExpression *)operator_new(0x98);
      Value::Value(&local_170,&local_d8);
      BoundConstantExpression::BoundConstantExpression(pBVar8,&local_170);
      local_188._M_head_impl = pBVar8;
      Value::~Value(&local_170);
      pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           *)&local_1b0);
      (*(pEVar9->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_170,pEVar9);
      pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           *)&local_1b0);
      (*(pEVar9->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_190,pEVar9);
      local_1a0.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl._0_1_ = (duckdb)0x1b;
      make_uniq_base<duckdb::Expression,duckdb::BoundComparisonExpression,duckdb::ExpressionType,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,duckdb::unique_ptr<duckdb::BoundConstantExpression,std::default_delete<duckdb::BoundConstantExpression>,true>>
                ((duckdb *)&local_198,(ExpressionType *)&local_1a0,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_190,
                 (unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
                  *)&local_188);
      local_1b9 = COMPARE_GREATERTHANOREQUALTO;
      make_uniq_base<duckdb::Expression,duckdb::BoundComparisonExpression,duckdb::ExpressionType,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,duckdb::unique_ptr<duckdb::BoundConstantExpression,std::default_delete<duckdb::BoundConstantExpression>,true>>
                ((duckdb *)&local_1a0,&local_1b9,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_170,
                 (unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
                  *)&local_180);
      pBVar10 = unique_ptr<duckdb::BoundConjunctionExpression,_std::default_delete<duckdb::BoundConjunctionExpression>,_true>
                ::operator->((unique_ptr<duckdb::BoundConjunctionExpression,_std::default_delete<duckdb::BoundConjunctionExpression>,_true>
                              *)&local_1b8);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&pBVar10->children,&local_1a0);
      pBVar10 = unique_ptr<duckdb::BoundConjunctionExpression,_std::default_delete<duckdb::BoundConjunctionExpression>,_true>
                ::operator->((unique_ptr<duckdb::BoundConjunctionExpression,_std::default_delete<duckdb::BoundConjunctionExpression>,_true>
                              *)&local_1b8);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&pBVar10->children,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_198);
      _Var1._M_head_impl = local_1b8._M_head_impl;
      local_1b8._M_head_impl = (BoundConjunctionExpression *)0x0;
      (this->super_Rule)._vptr_Rule = (_func_int **)_Var1._M_head_impl;
      if ((long *)CONCAT71(local_1a0.
                           super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                           ._M_t.
                           super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                           .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl._1_7_,
                           local_1a0.
                           super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                           ._M_t.
                           super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                           .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl._0_1_)
          != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(local_1a0.
                                       super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                       ._M_t.
                                       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                                       .super__Head_base<0UL,_duckdb::Expression_*,_false>.
                                       _M_head_impl._1_7_,
                                       local_1a0.
                                       super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                       ._M_t.
                                       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                                       .super__Head_base<0UL,_duckdb::Expression_*,_false>.
                                       _M_head_impl._0_1_) + 8))();
      }
      if (local_198._M_head_impl != (Expression *)0x0) {
        (*((local_198._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      if (local_190._M_head_impl != (Expression *)0x0) {
        (*((local_190._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
          local_170.type_._0_8_ != (Expression *)0x0) {
        (**(code **)(*(long *)local_170.type_._0_8_ + 8))();
      }
      if (local_188._M_head_impl != (BoundConstantExpression *)0x0) {
        (*((local_188._M_head_impl)->super_Expression).super_BaseExpression._vptr_BaseExpression[1])
                  ();
      }
      Value::~Value(&local_d8);
      Value::~Value(&local_98);
    }
    else {
      (this->super_Rule)._vptr_Rule = (_func_int **)0x0;
    }
    if (local_180._M_head_impl != (BoundConstantExpression *)0x0) {
      (*((local_180._M_head_impl)->super_Expression).super_BaseExpression._vptr_BaseExpression[1])()
      ;
    }
    Value::~Value(&local_58);
  }
  else {
    (this->super_Rule)._vptr_Rule = (_func_int **)0x0;
  }
  Value::~Value(&local_118);
  if (local_1b8._M_head_impl != (BoundConjunctionExpression *)0x0) {
    (*((local_1b8._M_head_impl)->super_Expression).super_BaseExpression._vptr_BaseExpression[1])();
  }
  if (local_1b0._M_head_impl != (Expression *)0x0) {
    (*((local_1b0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  if (local_1a8._M_head_impl != (Expression *)0x0) {
    (*((local_1a8._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> TimeStampComparison::Apply(LogicalOperator &op, vector<reference<Expression>> &bindings,
                                                  bool &changes_made, bool is_root) {
	auto cast_constant = bindings[3].get().Copy();
	auto cast_columnref = bindings[2].get().Copy();
	auto is_constant = true;
	ExpressionIsConstant(*cast_constant, is_constant);
	if (!is_constant) {
		// means the matchers are flipped, so we need to flip our bindings
		// for some reason an extra binding is added in this case.
		cast_constant = bindings[4].get().Copy();
		cast_columnref = bindings[3].get().Copy();
	}
	auto new_expr = make_uniq<BoundConjunctionExpression>(ExpressionType::CONJUNCTION_AND);

	Value result;
	if (ExpressionExecutor::TryEvaluateScalar(context, *cast_constant, result)) {
		D_ASSERT(result.type() == LogicalType::DATE);
		auto original_val = result.GetValue<duckdb::date_t>();
		auto no_seconds = dtime_t(0);

		// original date as timestamp with no seconds
		auto original_val_ts = Value::TIMESTAMP(original_val, no_seconds);
		auto original_val_for_comparison = make_uniq<BoundConstantExpression>(original_val_ts);

		// add one day and validate the new date
		// code is inspired by AddOperator::Operation(date_t left, int32_t right). The function wasn't used directly
		// since it throws errors that I cannot catch here.

		auto date_t_copy = result.GetValue<duckdb::date_t>();
		date_t date_t_result;
		// attempt to add 1 day
		if (!TryAddOperator::Operation<date_t, int32_t, date_t>(date_t_copy, 1, date_t_result)) {
			// don't rewrite the expression and let the expression executor handle the invalid date
			return nullptr;
		}

		auto result_as_val = Value::DATE(date_t_result);
		auto original_val_plus_on_date_ts = Value::TIMESTAMP(result_as_val.GetValue<timestamp_t>());

		auto val_for_comparison = make_uniq<BoundConstantExpression>(original_val_plus_on_date_ts);

		auto left_copy = cast_columnref->Copy();
		auto right_copy = cast_columnref->Copy();
		auto lt_eq_expr = make_uniq_base<Expression, BoundComparisonExpression>(
		    ExpressionType::COMPARE_LESSTHAN, std::move(right_copy), std::move(val_for_comparison));
		auto gt_eq_expr = make_uniq_base<Expression, BoundComparisonExpression>(
		    ExpressionType::COMPARE_GREATERTHANOREQUALTO, std::move(left_copy), std::move(original_val_for_comparison));
		new_expr->children.push_back(std::move(gt_eq_expr));
		new_expr->children.push_back(std::move(lt_eq_expr));
		return std::move(new_expr);
	}
	return nullptr;
}